

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

cmDocumentationEntry * cmGlobalNinjaMultiGenerator::GetDocumentation(void)

{
  cmDocumentationEntry *in_RDI;
  allocator<char> local_11;
  
  GetActualName_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->Brief,"Generates build-<Config>.ninja files.",&local_11);
  in_RDI->CustomNamePrefix = ' ';
  return in_RDI;
}

Assistant:

cmDocumentationEntry cmGlobalNinjaMultiGenerator::GetDocumentation()
{
  return { cmGlobalNinjaMultiGenerator::GetActualName(),
           "Generates build-<Config>.ninja files." };
}